

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  UnitTestImpl *pUVar6;
  char *pcVar7;
  TestRole TVar8;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_58;
  int local_54;
  int pipe_fd [2];
  int local_30;
  allocator<char> local_29;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_78,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O2/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                       ,0x44e);
    Message::Message((Message *)&local_98);
    poVar1 = (ostream *)(local_98._M_dataplus._M_p + 0x10);
    std::operator<<(poVar1,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar1," in a threaded context. For this test, ");
    std::operator<<(poVar1,"Google Test");
    std::operator<<(poVar1," ");
    if (sVar4 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar1,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar1,pcVar7);
    std::operator<<(poVar1,
                    " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<(poVar1," for more explanation and suggested solutions, especially if");
    std::operator<<(poVar1," this is the last message you see before your test times out.");
    StringStreamToString((string *)pipe_fd,(stringstream *)local_98._M_dataplus._M_p);
    if ((stringstream *)local_98._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))(local_98._M_dataplus._M_p);
    }
    std::operator<<((ostream *)&std::cerr,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog((GTestLog *)&local_78);
  }
  iVar2 = pipe(&local_58);
  if (iVar2 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pipe_fd,"",(allocator<char> *)&local_98);
    DeathTest::set_last_death_test_message((string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    CaptureStderr();
    FlushInfoLog();
    _Var3 = fork();
    if (_Var3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CHECK failed: File ",(allocator<char> *)&local_30);
      std::operator+(&local_f8,&local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O2/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_118,&local_f8,", line ");
      local_138._M_dataplus._M_p._0_4_ = 0x460;
      StreamableToString<int>(&local_b8,(int *)&local_138);
      std::operator+(&local_78,&local_118,&local_b8);
      std::operator+(&local_98,&local_78,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     &local_98,"child_pid != -1");
      DeathTestAbort((string *)pipe_fd);
    }
    *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
    if (_Var3 == 0) {
      TVar8 = EXECUTE_TEST;
      while( true ) {
        iVar2 = close(local_58);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"CHECK failed: File ",&local_29);
          std::operator+(&local_d8,&local_b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O2/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_f8,&local_d8,", line ");
          local_30 = 0x463;
          StreamableToString<int>(&local_138,&local_30);
          std::operator+(&local_118,&local_f8,&local_138);
          std::operator+(&local_78,&local_118,": ");
          std::operator+(&local_98,&local_78,"close(pipe_fd[0])");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_98," != -1");
          DeathTestAbort((string *)pipe_fd);
        }
      }
      (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_54;
      pUVar6 = GetUnitTestImpl();
      ((pUVar6->listeners_).repeater_)->forwarding_enabled_ = false;
      g_in_fast_death_test_child = 1;
    }
    else {
      while( true ) {
        iVar2 = close(local_54);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"CHECK failed: File ",&local_29);
          std::operator+(&local_d8,&local_b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O2/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_f8,&local_d8,", line ");
          local_30 = 0x46f;
          StreamableToString<int>(&local_138,&local_30);
          std::operator+(&local_118,&local_f8,&local_138);
          std::operator+(&local_78,&local_118,": ");
          std::operator+(&local_98,&local_78,"close(pipe_fd[1])");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_98," != -1");
          DeathTestAbort((string *)pipe_fd);
        }
      }
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_58;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      TVar8 = OVERSEE_TEST;
    }
    return TVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CHECK failed: File ",(allocator<char> *)&local_30);
  std::operator+(&local_f8,&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O2/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_118,&local_f8,", line ");
  local_138._M_dataplus._M_p._0_4_ = 0x452;
  StreamableToString<int>(&local_b8,(int *)&local_138);
  std::operator+(&local_78,&local_118,&local_b8);
  std::operator+(&local_98,&local_78,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                 &local_98,"pipe(pipe_fd) != -1");
  DeathTestAbort((string *)pipe_fd);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}